

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::QToolBarLayout(QToolBarLayout *this,QWidget *parent)

{
  QWidget *parent_00;
  QToolBarExtension *this_00;
  QMainWindow *pQVar1;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::QLayout(&this->super_QLayout,parent);
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007d7fc8;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QToolBarLayout_007d80d0;
  *(undefined2 *)&(this->super_QLayout).super_QLayoutItem.field_0xc = 0;
  (this->items).d.d = (Data *)0x0;
  (this->items).d.ptr = (QToolBarItem **)0x0;
  (this->items).d.size = 0;
  (this->hint).wd.m_i = -1;
  (this->hint).ht.m_i = -1;
  (this->minSize).wd.m_i = -1;
  (this->minSize).ht.m_i = -1;
  this->dirty = true;
  this->expanding = false;
  this->empty = true;
  this->expandFlag = false;
  (this->geomArray).d.d = (Data *)0x0;
  (this->geomArray).d.ptr = (QLayoutStruct *)0x0;
  (this->geomArray).d.size = 0;
  (this->handRect).x1 = 0;
  (this->handRect).y1 = 0;
  (this->handRect).x2 = -1;
  (this->handRect).y2 = -1;
  this->popupMenu = (QMenu *)0x0;
  parent_00 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&parent->super_QObject)->
               super_QWidget;
  if (parent_00 != (QWidget *)0x0) {
    this_00 = (QToolBarExtension *)operator_new(0x30);
    QToolBarExtension::QToolBarExtension((QToolBarExtension *)this_00,parent_00);
    this->extension = this_00;
    QWidget::setFocusPolicy((QWidget *)this_00,NoFocus);
    QWidget::hide((QWidget *)this->extension);
    QObject::connect((QObject *)&CStack_28,(char *)parent_00,
                     (QObject *)"2orientationChanged(Qt::Orientation)",(char *)this->extension,
                     0x667144);
    QMetaObject::Connection::~Connection(&CStack_28);
    pQVar1 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                       (*(QObject **)(*(long *)&parent_00->field_0x8 + 0x10));
    setUsePopupMenu(this,pQVar1 == (QMainWindow *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBarLayout::QToolBarLayout(QWidget *parent)
    : QLayout(parent), expanded(false), animating(false), dirty(true),
        expanding(false), empty(true), expandFlag(false), popupMenu(nullptr)
{
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (!tb)
        return;

    extension = new QToolBarExtension(tb);
    extension->setFocusPolicy(Qt::NoFocus);
    extension->hide();
    QObject::connect(tb, SIGNAL(orientationChanged(Qt::Orientation)),
                     extension, SLOT(setOrientation(Qt::Orientation)));

    setUsePopupMenu(qobject_cast<QMainWindow*>(tb->parentWidget()) == 0);
}